

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void save_template_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  Fl_Double_Window *__stat_loc;
  int local_1084;
  uchar *puStack_1080;
  int i;
  png_bytep ptr;
  png_infop iptr;
  png_structp pptr;
  FILE *fp;
  int h;
  int w;
  uchar *pixels;
  Fl_Window_Type *wt;
  Fl_Type *t;
  char *ext;
  char filename [2048];
  char **local_830;
  char *safeptr;
  char safename [2048];
  char *c;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  if (template_panel == (Fl_Double_Window *)0x0) {
    make_template_panel();
  }
  template_clear();
  Fl_Browser::add(template_browser,"New Template",(void *)0x0);
  template_load();
  (*(template_name->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl_Input_::value(&template_name->super_Fl_Input_,"");
  (*(template_instance->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])();
  (*(template_delete->super_Fl_Widget)._vptr_Fl_Widget[5])();
  Fl_Widget::deactivate(&template_delete->super_Fl_Widget);
  Fl_Widget::label((Fl_Widget *)template_submit,"Save");
  Fl_Widget::deactivate((Fl_Widget *)template_submit);
  Fl_Window::label(&template_panel->super_Fl_Window,"Save Template");
  (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  while (__stat_loc = template_panel, iVar1 = Fl_Window::shown(&template_panel->super_Fl_Window),
        iVar1 != 0) {
    Fl::wait(__stat_loc);
  }
  pcVar2 = Fl_Input_::value(&template_name->super_Fl_Input_);
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    fl_strlcpy((char *)&safeptr,pcVar2,0x800);
    for (local_830 = &safeptr; *(char *)local_830 != '\0';
        local_830 = (char **)((long)local_830 + 1)) {
      iVar1 = isspace((int)*(char *)local_830);
      if (iVar1 != 0) {
        *(char *)local_830 = '_';
      }
    }
    Fl_Preferences::getUserdataPath(&fluid_prefs,(char *)&ext,0x800);
    fl_strlcat((char *)&ext,"templates",0x800);
    iVar1 = access((char *)&ext,0);
    if (iVar1 != 0) {
      mkdir((char *)&ext,0x1ff);
    }
    fl_strlcat((char *)&ext,"/",0x800);
    fl_strlcat((char *)&ext,(char *)&safeptr,0x800);
    sVar3 = strlen((char *)&ext);
    t = (Fl_Type *)(filename + (sVar3 - 8));
    if (t < (Fl_Type *)(filename + 0x7f3)) {
      strcpy((char *)t,".fl");
      iVar1 = access((char *)&ext,0);
      if ((iVar1 != 0) ||
         (iVar1 = fl_choice("The template \"%s\" already exists.\nDo you want to replace it?",
                            "Cancel","Replace",(char *)0x0,pcVar2), iVar1 != 0)) {
        iVar1 = write_file((char *)&ext,0);
        if (iVar1 == 0) {
          piVar4 = __errno_location();
          pcVar2 = strerror(*piVar4);
          fl_alert("Error writing %s: %s",&ext,pcVar2);
        }
        else {
          wt = (Fl_Window_Type *)Fl_Type::first;
          while ((wt != (Fl_Window_Type *)0x0 &&
                 (iVar1 = (*(wt->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x21])(),
                 iVar1 == 0))) {
            wt = (Fl_Window_Type *)(wt->super_Fl_Widget_Type).super_Fl_Type.next;
          }
          if (wt != (Fl_Window_Type *)0x0) {
            pixels = (uchar *)wt;
            _h = Fl_Window_Type::read_image(wt,(int *)((long)&fp + 4),(int *)&fp);
            if (_h != (uchar *)0x0) {
              strcpy((char *)t,".png");
              pptr = (png_structp)fl_fopen((char *)&ext,"wb");
              if (pptr == (png_structp)0x0) {
                if (_h != (uchar *)0x0) {
                  operator_delete__(_h);
                }
                piVar4 = __errno_location();
                pcVar2 = strerror(*piVar4);
                fl_alert("Error writing %s: %s",&ext,pcVar2);
              }
              else {
                iptr = (png_infop)png_create_write_struct("1.6.37",0,0);
                ptr = (png_bytep)png_create_info_struct(iptr);
                puStack_1080 = _h;
                png_init_io(iptr,pptr);
                png_set_IHDR(iptr,ptr,fp._4_4_,(int)fp,8,2,0,0,0);
                png_set_sRGB(iptr,ptr,0);
                png_write_info(iptr,ptr);
                for (local_1084 = (int)fp; 0 < local_1084; local_1084 = local_1084 + -1) {
                  png_write_row(iptr,puStack_1080);
                  puStack_1080 = puStack_1080 + fp._4_4_ * 3;
                }
                png_write_end(iptr,ptr);
                png_destroy_write_struct(&iptr,&ptr);
                fclose((FILE *)pptr);
                if (_h != (uchar *)0x0) {
                  operator_delete__(_h);
                }
              }
            }
          }
        }
      }
    }
    else {
      fl_alert("The template name \"%s\" is too long!",pcVar2);
    }
  }
  return;
}

Assistant:

void save_template_cb(Fl_Widget *, void *) {
  // Setup the template panel...
  if (!template_panel) make_template_panel();

  template_clear();
  template_browser->add("New Template");
  template_load();

  template_name->show();
  template_name->value("");

  template_instance->hide();

  template_delete->show();
  template_delete->deactivate();

  template_submit->label("Save");
  template_submit->deactivate();

  template_panel->label("Save Template");

  // Show the panel and wait for the user to do something...
  template_panel->show();
  while (template_panel->shown()) Fl::wait();

  // Get the template name, return if it is empty...
  const char *c = template_name->value();
  if (!c || !*c) return;

  // Convert template name to filename_with_underscores
  char safename[FL_PATH_MAX], *safeptr;
  strlcpy(safename, c, sizeof(safename));
  for (safeptr = safename; *safeptr; safeptr ++) {
    if (isspace(*safeptr)) *safeptr = '_';
  }

  // Find the templates directory...
  char filename[FL_PATH_MAX];
  fluid_prefs.getUserdataPath(filename, sizeof(filename));

  strlcat(filename, "templates", sizeof(filename));
#if defined(WIN32) && !defined(__CYGWIN__)
  if (access(filename, 0)) mkdir(filename);
#else
  if (access(filename, 0)) mkdir(filename, 0777);
#endif // WIN32 && !__CYGWIN__

  strlcat(filename, "/", sizeof(filename));
  strlcat(filename, safename, sizeof(filename));

  char *ext = filename + strlen(filename);
  if (ext >= (filename + sizeof(filename) - 5)) {
    fl_alert("The template name \"%s\" is too long!", c);
    return;
  }

  // Save the .fl file...
  strcpy(ext, ".fl");

  if (!access(filename, 0)) {
    if (fl_choice("The template \"%s\" already exists.\n"
                  "Do you want to replace it?", "Cancel",
		  "Replace", NULL, c) == 0) return;
  }

  if (!write_file(filename)) {
    fl_alert("Error writing %s: %s", filename, strerror(errno));
    return;
  }

#if defined(HAVE_LIBPNG) && defined(HAVE_LIBZ)
  // Get the screenshot, if any...
  Fl_Type *t;

  for (t = Fl_Type::first; t; t = t->next) {
    // Find the first window...
    if (t->is_window()) break;
  }

  if (!t) return;

  // Grab a screenshot...
  Fl_Window_Type *wt = (Fl_Window_Type *)t;
  uchar *pixels;
  int w, h;

  if ((pixels = wt->read_image(w, h)) == NULL) return;

  // Save to a PNG file...
  strcpy(ext, ".png");

  FILE *fp;

  if ((fp = fl_fopen(filename, "wb")) == NULL) {
    delete[] pixels;
    fl_alert("Error writing %s: %s", filename, strerror(errno));
    return;
  }

  png_structp pptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
  png_infop iptr = png_create_info_struct(pptr);
  png_bytep ptr = (png_bytep)pixels;

  png_init_io(pptr, fp);
  png_set_IHDR(pptr, iptr, w, h, 8, PNG_COLOR_TYPE_RGB, PNG_INTERLACE_NONE,
               PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
  png_set_sRGB(pptr, iptr, PNG_sRGB_INTENT_PERCEPTUAL);

  png_write_info(pptr, iptr);

  for (int i = h; i > 0; i --, ptr += w * 3) {
    png_write_row(pptr, ptr);
  }

  png_write_end(pptr, iptr);
  png_destroy_write_struct(&pptr, &iptr);

  fclose(fp);

#  if 0 // The original PPM output code...
  strcpy(ext, ".ppm");
  fp = fl_fopen(filename, "wb");
  fprintf(fp, "P6\n%d %d 255\n", w, h);
  fwrite(pixels, w * h, 3, fp);
  fclose(fp);
#  endif // 0

  delete[] pixels;
#endif // HAVE_LIBPNG && HAVE_LIBZ
}